

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

ObjectPtr<tvm::runtime::LibraryModuleNode> __thiscall
tvm::runtime::ObjAllocatorBase<tvm::runtime::SimpleObjAllocator>::
make_object<tvm::runtime::LibraryModuleNode,tvm::runtime::ObjectPtr<tvm::runtime::Library>&>
          (ObjAllocatorBase<tvm::runtime::SimpleObjAllocator> *this,
          ObjectPtr<tvm::runtime::Library> *args)

{
  RefCounterType *pRVar1;
  LibraryModuleNode *pLVar2;
  ObjectPtr<tvm::runtime::Library> *in_RDX;
  
  pLVar2 = SimpleObjAllocator::Handler<tvm::runtime::LibraryModuleNode>::
           New<tvm::runtime::ObjectPtr<tvm::runtime::Library>&>((SimpleObjAllocator *)args,in_RDX);
  (pLVar2->super_ModuleNode).super_Object.type_index_ = 3;
  (pLVar2->super_ModuleNode).super_Object.deleter_ =
       SimpleObjAllocator::Handler<tvm::runtime::LibraryModuleNode>::Deleter_;
  *(Object **)this = &(pLVar2->super_ModuleNode).super_Object;
  LOCK();
  pRVar1 = &(pLVar2->super_ModuleNode).super_Object.ref_counter_;
  (pRVar1->super___atomic_base<int>)._M_i = (pRVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return (ObjectPtr<tvm::runtime::LibraryModuleNode>)(Object *)this;
}

Assistant:

inline ObjectPtr<T> make_object(Args&&... args) {
    using Handler = typename Derived::template Handler<T>;
    static_assert(std::is_base_of<Object, T>::value,
                  "make can only be used to create Object");
    T* ptr = Handler::New(static_cast<Derived*>(this),
                         std::forward<Args>(args)...);
    ptr->type_index_ = T::RuntimeTypeIndex();
    ptr->deleter_ = Handler::Deleter();
    return ObjectPtr<T>(ptr);
  }